

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_input_pack4_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [16];
  long *in_RSI;
  long *in_RDI;
  __m128 _r0tm5;
  __m128 _r0tm4;
  __m128 _r0tm3;
  __m128 _r0tm2;
  __m128 _r0tm1;
  __m128 _r0tm0;
  __m128 _tmp05;
  __m128 _tmp04;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m128 _tmp5m;
  __m128 _tmp4m;
  __m128 _tmp3m;
  __m128 _tmp2m;
  __m128 _tmp1m;
  __m128 _tmp0m;
  __m128 _r05;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  __m128 _v2;
  __m128 _vm2;
  __m128 _v4;
  __m128 _vm4;
  __m128 _vm5;
  float tmp [6] [6] [4];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_119c;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 *local_1178;
  undefined8 *local_1170;
  int local_109c;
  undefined8 *local_1098;
  int local_1090;
  int local_108c;
  long local_1038 [92];
  int local_d54;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar27 = in_RDI[7];
  iVar28 = (iVar1 + -2) / 4;
  iVar29 = ((int)in_RDI[6] + -2) / 4;
  iVar30 = iVar28 * iVar29;
  for (local_d54 = 0; local_d54 < (int)lVar27; local_d54 = local_d54 + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    local_1038[0x4a] = *in_RSI + in_RSI[8] * (long)local_d54 * in_RSI[2];
    for (local_108c = 0; local_108c < iVar29; local_108c = local_108c + 1) {
      for (local_1090 = 0; local_1090 < iVar28; local_1090 = local_1090 + 1) {
        local_1098 = (undefined8 *)
                     (lVar3 + lVar4 * local_d54 * lVar5 +
                      (long)iVar2 * (long)(local_108c << 2) * lVar6 + (long)(local_1090 << 4) * 4);
        for (local_109c = 0; local_109c < 6; local_109c = local_109c + 1) {
          pauVar31 = (undefined1 (*) [16])(local_1098 + 2);
          pauVar32 = (undefined1 (*) [16])(local_1098 + 4);
          pauVar33 = (undefined1 (*) [16])(local_1098 + 6);
          pauVar34 = (undefined1 (*) [16])(local_1098 + 8);
          local_4b8 = (float)*local_1098;
          fStack_4b4 = (float)((ulong)*local_1098 >> 0x20);
          fStack_4b0 = (float)local_1098[1];
          fStack_4ac = (float)((ulong)local_1098[1] >> 0x20);
          local_4d8 = (float)*(undefined8 *)*pauVar34;
          fStack_4d4 = (float)((ulong)*(undefined8 *)*pauVar34 >> 0x20);
          fStack_4d0 = (float)local_1098[9];
          fStack_4cc = (float)((ulong)local_1098[9] >> 0x20);
          local_498 = (float)*(undefined8 *)*pauVar32;
          fStack_494 = (float)((ulong)*(undefined8 *)*pauVar32 >> 0x20);
          fStack_490 = (float)local_1098[5];
          fStack_48c = (float)((ulong)local_1098[5] >> 0x20);
          local_9c8 = (float)*(undefined8 *)*pauVar31;
          fStack_9c4 = (float)((ulong)*(undefined8 *)*pauVar31 >> 0x20);
          fStack_9c0 = (float)local_1098[3];
          fStack_9bc = (float)((ulong)local_1098[3] >> 0x20);
          local_9f8 = (float)*(undefined8 *)*pauVar33;
          fStack_9f4 = (float)((ulong)*(undefined8 *)*pauVar33 >> 0x20);
          fStack_9f0 = (float)local_1098[7];
          fStack_9ec = (float)((ulong)local_1098[7] >> 0x20);
          auVar7 = vsubps_avx(*pauVar31,*pauVar32);
          auVar8 = vsubps_avx(*pauVar34,*pauVar33);
          local_458 = auVar7._0_4_;
          fStack_454 = auVar7._4_4_;
          fStack_450 = auVar7._8_4_;
          fStack_44c = auVar7._12_4_;
          local_5c8 = auVar8._0_4_;
          fStack_5c4 = auVar8._4_4_;
          fStack_5c0 = auVar8._8_4_;
          fStack_5bc = auVar8._12_4_;
          auVar7 = vsubps_avx(*pauVar31,*pauVar33);
          auVar8 = vsubps_avx(*pauVar34,*pauVar32);
          local_438 = auVar7._0_4_;
          fStack_434 = auVar7._4_4_;
          fStack_430 = auVar7._8_4_;
          fStack_42c = auVar7._12_4_;
          local_618 = auVar8._0_4_;
          fStack_614 = auVar8._4_4_;
          fStack_610 = auVar8._8_4_;
          fStack_60c = auVar8._12_4_;
          auVar7 = vsubps_avx(*pauVar31,*pauVar33);
          auVar8 = vsubps_avx(*pauVar34,*pauVar32);
          local_418 = auVar7._0_4_;
          fStack_414 = auVar7._4_4_;
          fStack_410 = auVar7._8_4_;
          fStack_40c = auVar7._12_4_;
          local_668 = auVar8._0_4_;
          fStack_664 = auVar8._4_4_;
          fStack_660 = auVar8._8_4_;
          fStack_65c = auVar8._12_4_;
          local_6b8 = (float)local_1098[10];
          fStack_6b4 = (float)((ulong)local_1098[10] >> 0x20);
          fStack_6b0 = (float)local_1098[0xb];
          fStack_6ac = (float)((ulong)local_1098[0xb] >> 0x20);
          local_1038[(long)local_109c * 2] =
               CONCAT44(fStack_494 * -5.0 + fStack_4b4 * 4.0 + fStack_4d4,
                        local_498 * -5.0 + local_4b8 * 4.0 + local_4d8);
          local_1038[(long)local_109c * 2 + 1] =
               CONCAT44(fStack_48c * -5.0 + fStack_4ac * 4.0 + fStack_4cc,
                        fStack_490 * -5.0 + fStack_4b0 * 4.0 + fStack_4d0);
          local_1038[(long)local_109c * 2 + 0xc] =
               CONCAT44((fStack_9c4 + fStack_494) * -4.0 + fStack_4d4 + fStack_9f4,
                        (local_9c8 + local_498) * -4.0 + local_4d8 + local_9f8);
          local_1038[(long)local_109c * 2 + 0xd] =
               CONCAT44((fStack_9bc + fStack_48c) * -4.0 + fStack_4cc + fStack_9ec,
                        (fStack_9c0 + fStack_490) * -4.0 + fStack_4d0 + fStack_9f0);
          local_1038[(long)local_109c * 2 + 0x18] =
               CONCAT44(fStack_454 * 4.0 + fStack_5c4,local_458 * 4.0 + local_5c8);
          local_1038[(long)local_109c * 2 + 0x19] =
               CONCAT44(fStack_44c * 4.0 + fStack_5bc,fStack_450 * 4.0 + fStack_5c0);
          local_1038[(long)local_109c * 2 + 0x24] =
               CONCAT44(fStack_434 * -2.0 + fStack_614,local_438 * -2.0 + local_618);
          local_1038[(long)local_109c * 2 + 0x25] =
               CONCAT44(fStack_42c * -2.0 + fStack_60c,fStack_430 * -2.0 + fStack_610);
          local_1038[(long)local_109c * 2 + 0x30] =
               CONCAT44(fStack_414 * 2.0 + fStack_664,local_418 * 2.0 + local_668);
          local_1038[(long)local_109c * 2 + 0x31] =
               CONCAT44(fStack_40c * 2.0 + fStack_65c,fStack_410 * 2.0 + fStack_660);
          local_1038[(long)local_109c * 2 + 0x3c] =
               CONCAT44(fStack_9f4 * -5.0 + fStack_9c4 * 4.0 + fStack_6b4,
                        local_9f8 * -5.0 + local_9c8 * 4.0 + local_6b8);
          local_1038[(long)local_109c * 2 + 0x3d] =
               CONCAT44(fStack_9ec * -5.0 + fStack_9bc * 4.0 + fStack_6ac,
                        fStack_9f0 * -5.0 + fStack_9c0 * 4.0 + fStack_6b0);
          local_1098 = (undefined8 *)((long)local_1098 + (long)(iVar1 << 2) * 4);
        }
        local_1170 = (undefined8 *)
                     (local_1038[0x4a] + (long)((local_108c * iVar28 + local_1090) * 4) * 4);
        local_1178 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 4) * 4);
        local_1180 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 8) * 4);
        local_1188 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 0xc) * 4);
        local_1190 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 0x10) * 4);
        local_1198 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 0x14) * 4);
        for (local_119c = 0; local_119c < 6; local_119c = local_119c + 1) {
          lVar9 = local_1038[(long)local_119c * 0xc + 2];
          lVar10 = local_1038[(long)local_119c * 0xc + 3];
          lVar11 = local_1038[(long)local_119c * 0xc + 4];
          lVar12 = local_1038[(long)local_119c * 0xc + 5];
          lVar13 = local_1038[(long)local_119c * 0xc + 6];
          lVar14 = local_1038[(long)local_119c * 0xc + 7];
          lVar15 = local_1038[(long)local_119c * 0xc + 8];
          lVar16 = local_1038[(long)local_119c * 0xc + 9];
          local_3b8 = (float)local_1038[(long)local_119c * 0xc];
          fStack_3b4 = (float)((ulong)local_1038[(long)local_119c * 0xc] >> 0x20);
          fStack_3b0 = (float)local_1038[(long)local_119c * 0xc + 1];
          fStack_3ac = (float)((ulong)local_1038[(long)local_119c * 0xc + 1] >> 0x20);
          local_758 = (float)lVar15;
          fStack_754 = (float)((ulong)lVar15 >> 0x20);
          fStack_750 = (float)lVar16;
          fStack_74c = (float)((ulong)lVar16 >> 0x20);
          local_398 = (float)lVar11;
          fStack_394 = (float)((ulong)lVar11 >> 0x20);
          fStack_390 = (float)lVar12;
          fStack_38c = (float)((ulong)lVar12 >> 0x20);
          local_a08 = (float)lVar9;
          fStack_a04 = (float)((ulong)lVar9 >> 0x20);
          fStack_a00 = (float)lVar10;
          fStack_9fc = (float)((ulong)lVar10 >> 0x20);
          local_a38 = (float)lVar13;
          fStack_a34 = (float)((ulong)lVar13 >> 0x20);
          fStack_a30 = (float)lVar14;
          fStack_a2c = (float)((ulong)lVar14 >> 0x20);
          auVar26._8_8_ = lVar10;
          auVar26._0_8_ = lVar9;
          auVar25._8_8_ = lVar12;
          auVar25._0_8_ = lVar11;
          auVar7 = vsubps_avx(auVar26,auVar25);
          auVar24._8_8_ = lVar16;
          auVar24._0_8_ = lVar15;
          auVar23._8_8_ = lVar14;
          auVar23._0_8_ = lVar13;
          auVar8 = vsubps_avx(auVar24,auVar23);
          local_358 = auVar7._0_4_;
          fStack_354 = auVar7._4_4_;
          fStack_350 = auVar7._8_4_;
          fStack_34c = auVar7._12_4_;
          local_848 = auVar8._0_4_;
          fStack_844 = auVar8._4_4_;
          fStack_840 = auVar8._8_4_;
          fStack_83c = auVar8._12_4_;
          auVar22._8_8_ = lVar10;
          auVar22._0_8_ = lVar9;
          auVar21._8_8_ = lVar14;
          auVar21._0_8_ = lVar13;
          auVar7 = vsubps_avx(auVar22,auVar21);
          auVar20._8_8_ = lVar16;
          auVar20._0_8_ = lVar15;
          auVar19._8_8_ = lVar12;
          auVar19._0_8_ = lVar11;
          auVar8 = vsubps_avx(auVar20,auVar19);
          local_338 = auVar7._0_4_;
          fStack_334 = auVar7._4_4_;
          fStack_330 = auVar7._8_4_;
          fStack_32c = auVar7._12_4_;
          local_898 = auVar8._0_4_;
          fStack_894 = auVar8._4_4_;
          fStack_890 = auVar8._8_4_;
          fStack_88c = auVar8._12_4_;
          auVar18._8_8_ = lVar10;
          auVar18._0_8_ = lVar9;
          auVar7._8_8_ = lVar14;
          auVar7._0_8_ = lVar13;
          auVar7 = vsubps_avx(auVar18,auVar7);
          auVar17._8_8_ = lVar16;
          auVar17._0_8_ = lVar15;
          auVar8._8_8_ = lVar12;
          auVar8._0_8_ = lVar11;
          auVar8 = vsubps_avx(auVar17,auVar8);
          local_318 = auVar7._0_4_;
          fStack_314 = auVar7._4_4_;
          fStack_310 = auVar7._8_4_;
          fStack_30c = auVar7._12_4_;
          local_8e8 = auVar8._0_4_;
          fStack_8e4 = auVar8._4_4_;
          fStack_8e0 = auVar8._8_4_;
          fStack_8dc = auVar8._12_4_;
          local_938 = (float)local_1038[(long)local_119c * 0xc + 10];
          fStack_934 = (float)((ulong)local_1038[(long)local_119c * 0xc + 10] >> 0x20);
          fStack_930 = (float)local_1038[(long)local_119c * 0xc + 0xb];
          fStack_92c = (float)((ulong)local_1038[(long)local_119c * 0xc + 0xb] >> 0x20);
          *local_1170 = CONCAT44(fStack_394 * -5.0 + fStack_3b4 * 4.0 + fStack_754,
                                 local_398 * -5.0 + local_3b8 * 4.0 + local_758);
          local_1170[1] =
               CONCAT44(fStack_38c * -5.0 + fStack_3ac * 4.0 + fStack_74c,
                        fStack_390 * -5.0 + fStack_3b0 * 4.0 + fStack_750);
          *local_1178 = CONCAT44((fStack_a04 + fStack_394) * -4.0 + fStack_754 + fStack_a34,
                                 (local_a08 + local_398) * -4.0 + local_758 + local_a38);
          local_1178[1] =
               CONCAT44((fStack_9fc + fStack_38c) * -4.0 + fStack_74c + fStack_a2c,
                        (fStack_a00 + fStack_390) * -4.0 + fStack_750 + fStack_a30);
          *local_1180 = CONCAT44(fStack_354 * 4.0 + fStack_844,local_358 * 4.0 + local_848);
          local_1180[1] = CONCAT44(fStack_34c * 4.0 + fStack_83c,fStack_350 * 4.0 + fStack_840);
          *local_1188 = CONCAT44(fStack_334 * -2.0 + fStack_894,local_338 * -2.0 + local_898);
          local_1188[1] = CONCAT44(fStack_32c * -2.0 + fStack_88c,fStack_330 * -2.0 + fStack_890);
          *local_1190 = CONCAT44(fStack_314 * 2.0 + fStack_8e4,local_318 * 2.0 + local_8e8);
          local_1190[1] = CONCAT44(fStack_30c * 2.0 + fStack_8dc,fStack_310 * 2.0 + fStack_8e0);
          *local_1198 = CONCAT44(fStack_a34 * -5.0 + fStack_a04 * 4.0 + fStack_934,
                                 local_a38 * -5.0 + local_a08 * 4.0 + local_938);
          local_1198[1] =
               CONCAT44(fStack_a2c * -5.0 + fStack_9fc * 4.0 + fStack_92c,
                        fStack_a30 * -5.0 + fStack_a00 * 4.0 + fStack_930);
          local_1170 = (undefined8 *)((long)local_1170 + (long)(iVar30 * 0x18) * 4);
          local_1178 = (undefined8 *)((long)local_1178 + (long)(iVar30 * 0x18) * 4);
          local_1180 = (undefined8 *)((long)local_1180 + (long)(iVar30 * 0x18) * 4);
          local_1188 = (undefined8 *)((long)local_1188 + (long)(iVar30 * 0x18) * 4);
          local_1190 = (undefined8 *)((long)local_1190 + (long)(iVar30 * 0x18) * 4);
          local_1198 = (undefined8 *)((long)local_1198 + (long)(iVar30 * 0x18) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_input_pack4_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 4;
    const int h_tiles = (h - 2) / 4;
    const int tiles = w_tiles * h_tiles;

    // const float itm[6][6] = {
    //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
    //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
    //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
    //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
    // };

    // 0 =  4 * r00 - 5 * r02 + r04
    // 1 = -4 * (r01 + r02) + r04 + r03
    // 2 =  4 * (r01 - r02) + r04 - r03
    // 3 = -2 * (r01 - r03) + r04 - r02
    // 4 =  2 * (r01 - r03) + r04 - r02
    // 5 =  4 * r01 - 5 * r03 + r05

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[6][6][4];

        __m128 _vm5 = _mm_set1_ps(-5.f);
        __m128 _vm4 = _mm_set1_ps(-4.f);
        __m128 _v4 = _mm_set1_ps(4.f);
        __m128 _vm2 = _mm_set1_ps(-2.f);
        __m128 _v2 = _mm_set1_ps(2.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 4) + (j * 4) * 4;

                for (int m = 0; m < 6; m++)
                {
                    __m128 _r00 = _mm_load_ps(r0);
                    __m128 _r01 = _mm_load_ps(r0 + 4);
                    __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r04 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r05 = _mm_load_ps(r0 + 4 * 5);

                    __m128 _tmp0m = _mm_comp_fmadd_ps(_vm5, _r02, _mm_comp_fmadd_ps(_v4, _r00, _r04));
                    __m128 _tmp1m = _mm_comp_fmadd_ps(_vm4, _mm_add_ps(_r01, _r02), _mm_add_ps(_r04, _r03));
                    __m128 _tmp2m = _mm_comp_fmadd_ps(_v4, _mm_sub_ps(_r01, _r02), _mm_sub_ps(_r04, _r03));
                    __m128 _tmp3m = _mm_comp_fmadd_ps(_vm2, _mm_sub_ps(_r01, _r03), _mm_sub_ps(_r04, _r02));
                    __m128 _tmp4m = _mm_comp_fmadd_ps(_v2, _mm_sub_ps(_r01, _r03), _mm_sub_ps(_r04, _r02));
                    __m128 _tmp5m = _mm_comp_fmadd_ps(_vm5, _r03, _mm_comp_fmadd_ps(_v4, _r01, _r05));

                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);
                    _mm_store_ps(tmp[3][m], _tmp3m);
                    _mm_store_ps(tmp[4][m], _tmp4m);
                    _mm_store_ps(tmp[5][m], _tmp5m);

                    r0 += w * 4;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 4;
                float* r0_tm_1 = r0_tm_0 + tiles * 4;
                float* r0_tm_2 = r0_tm_0 + tiles * 4 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 4 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 4 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 4 * 5;

                for (int m = 0; m < 6; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);

                    __m128 _r0tm0 = _mm_comp_fmadd_ps(_vm5, _tmp02, _mm_comp_fmadd_ps(_v4, _tmp00, _tmp04));
                    __m128 _r0tm1 = _mm_comp_fmadd_ps(_vm4, _mm_add_ps(_tmp01, _tmp02), _mm_add_ps(_tmp04, _tmp03));
                    __m128 _r0tm2 = _mm_comp_fmadd_ps(_v4, _mm_sub_ps(_tmp01, _tmp02), _mm_sub_ps(_tmp04, _tmp03));
                    __m128 _r0tm3 = _mm_comp_fmadd_ps(_vm2, _mm_sub_ps(_tmp01, _tmp03), _mm_sub_ps(_tmp04, _tmp02));
                    __m128 _r0tm4 = _mm_comp_fmadd_ps(_v2, _mm_sub_ps(_tmp01, _tmp03), _mm_sub_ps(_tmp04, _tmp02));
                    __m128 _r0tm5 = _mm_comp_fmadd_ps(_vm5, _tmp03, _mm_comp_fmadd_ps(_v4, _tmp01, _tmp05));

                    _mm_store_ps(r0_tm_0, _r0tm0);
                    _mm_store_ps(r0_tm_1, _r0tm1);
                    _mm_store_ps(r0_tm_2, _r0tm2);
                    _mm_store_ps(r0_tm_3, _r0tm3);
                    _mm_store_ps(r0_tm_4, _r0tm4);
                    _mm_store_ps(r0_tm_5, _r0tm5);

                    r0_tm_0 += tiles * 4 * 6;
                    r0_tm_1 += tiles * 4 * 6;
                    r0_tm_2 += tiles * 4 * 6;
                    r0_tm_3 += tiles * 4 * 6;
                    r0_tm_4 += tiles * 4 * 6;
                    r0_tm_5 += tiles * 4 * 6;
                }
            }
        }
    }
}